

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_prespch_buf.c
# Opt level: O0

void fe_prespch_write_pcm(prespch_buf_t *prespch_buf,int16 *samples)

{
  int32 sample_ptr;
  int16 *samples_local;
  prespch_buf_t *prespch_buf_local;
  
  memcpy(prespch_buf->pcm_buf + (int)prespch_buf->pcm_write_ptr * (int)prespch_buf->num_samples,
         samples,(long)prespch_buf->num_samples << 1);
  prespch_buf->pcm_write_ptr =
       (int16)((prespch_buf->pcm_write_ptr + 1) % (int)prespch_buf->num_frames_pcm);
  if (prespch_buf->npcm < prespch_buf->num_frames_pcm) {
    prespch_buf->npcm = prespch_buf->npcm + 1;
  }
  else {
    prespch_buf->pcm_read_ptr =
         (int16)((prespch_buf->pcm_read_ptr + 1) % (int)prespch_buf->num_frames_pcm);
  }
  return;
}

Assistant:

void
fe_prespch_write_pcm(prespch_buf_t * prespch_buf, int16 * samples)
{
    int32 sample_ptr;

    sample_ptr = prespch_buf->pcm_write_ptr * prespch_buf->num_samples;
    memcpy(&prespch_buf->pcm_buf[sample_ptr], samples,
           prespch_buf->num_samples * sizeof(int16));

    prespch_buf->pcm_write_ptr = (prespch_buf->pcm_write_ptr + 1) % prespch_buf->num_frames_pcm;
    if (prespch_buf->npcm < prespch_buf->num_frames_pcm) {
        prespch_buf->npcm++;	
    } else {
        prespch_buf->pcm_read_ptr = (prespch_buf->pcm_read_ptr + 1) % prespch_buf->num_frames_pcm;
    }
}